

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O1

UINT8 device_start_ym2610(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint clock;
  undefined8 *param;
  DEV_DATA *pDVar1;
  DEV_DEF *pDVar2;
  UINT32 rate;
  
  clock = cfg->clock;
  if ((cfg->srMode == '\x01') ||
     ((rate = clock / 0x90, cfg->srMode == '\x02' && (clock / 0x90 < cfg->smplRate)))) {
    rate = cfg->smplRate;
  }
  param = (undefined8 *)malloc(0x10);
  param[1] = 0;
  pDVar1 = (DEV_DATA *)ym2610_init(param,clock,rate,(FM_TIMERHANDLER)0x0,(FM_IRQHANDLER)0x0);
  *param = pDVar1;
  pDVar2 = &devDef_MAME_2610B;
  if (cfg->flags == '\0') {
    pDVar2 = &devDef_MAME_2610;
  }
  pDVar1->chipInf = param;
  retDevInf->dataPtr = pDVar1;
  retDevInf->sampleRate = rate;
  retDevInf->devDef = pDVar2;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  init_ssg_devinfo(retDevInf,cfg,'\x02','\"');
  return '\0';
}

Assistant:

static UINT8 device_start_ym2610(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	OPN_INF* info;
	DEV_DATA* devData;
	UINT32 rate;
	const DEV_DEF* devDefPtr;
	
	rate = cfg->clock / 2 / 72;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);
	
	info = (OPN_INF*)malloc(sizeof(OPN_INF));
	info->ssg = NULL;
	info->opn = ym2610_init(info, cfg->clock, rate, NULL, NULL);
	devDefPtr = cfg->flags ? &devDef_MAME_2610B : &devDef_MAME_2610;
	
	devData = (DEV_DATA*)info->opn;
	devData->chipInf = info;	// store pointer to OPN_INF into sound chip structure
	INIT_DEVINF(retDevInf, devData, rate, devDefPtr);
	init_ssg_devinfo(retDevInf, cfg, 2, AYTYPE_YM2610);
	return 0x00;
}